

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<long_long,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,longlong *values,int rows,
               int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  double dVar3;
  double dVar4;
  ImPlotPlot *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImPlotContext *pIVar8;
  ImPlotContext *pIVar9;
  longlong *plVar10;
  ImU32 col;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  ImVec4 IVar28;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_138;
  int local_12c;
  undefined1 local_128 [16];
  double local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  double local_f8;
  double local_f0;
  longlong *local_e8;
  char *local_e0;
  double local_d8;
  long local_d0;
  ulong local_c8;
  double local_c0;
  ImDrawList *local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  longlong *local_98;
  undefined8 uStack_90;
  double local_80;
  ulong local_78;
  ImPlotContext *local_70;
  double local_68;
  ImVec2 local_60;
  undefined1 local_58 [12];
  float fStack_4c;
  
  if (0 < rows) {
    dVar24 = (bounds_max->x - bounds_min->x) / (double)cols;
    local_f0 = (bounds_max->y - bounds_min->y) / (double)rows;
    dVar22 = dVar24 * 0.5;
    dVar26 = local_f0 * 0.5;
    lVar12 = (long)transformer.YAxis;
    local_b0 = scale_max - scale_min;
    local_c8 = (ulong)(uint)cols;
    uVar11 = 0;
    local_f8 = local_f0 * 0.5;
    dVar25 = dVar24 * 0.5;
    local_d0 = lVar12 * 0x10;
    dVar27 = 0.0;
    iVar14 = 0;
    local_70 = GImPlot;
    local_e8 = values;
    local_e0 = fmt;
    local_d8 = scale_min;
    local_c0 = dVar24;
    local_b8 = DrawList;
    local_68 = dVar25;
    do {
      plVar10 = local_e8;
      if (0 < cols) {
        dVar20 = local_f0 * dVar27 + local_f8;
        dVar21 = 0.0;
        lVar15 = 0;
        local_12c = iVar14;
        local_80 = dVar27;
        local_78 = uVar11;
        do {
          pIVar8 = GImPlot;
          local_108._0_8_ = dVar21;
          local_118 = dVar21 * dVar24 + bounds_min->x + dVar25;
          dVar27 = bounds_max->y - dVar20;
          dVar24 = log10((local_118 - dVar22) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = pIVar8->CurrentPlot;
          local_a8._8_4_ = extraout_XMM0_Dc;
          local_a8._0_8_ = dVar24;
          local_a8._12_4_ = extraout_XMM0_Dd;
          local_98 = (longlong *)pIVar8->LogDenX;
          uStack_90 = 0;
          dVar24 = (pIVar5->XAxis).Range.Min;
          local_128._8_8_ = 0;
          local_128._0_8_ = (pIVar5->XAxis).Range.Max;
          dVar25 = log10((dVar27 - dVar26) / pIVar5->YAxis[lVar12].Range.Min);
          pIVar9 = GImPlot;
          pIVar5 = pIVar8->CurrentPlot;
          auVar16._8_8_ = dVar25;
          auVar16._0_8_ = local_a8._0_8_;
          auVar17._8_4_ = SUB84(pIVar8->LogDenY[lVar12],0);
          auVar17._0_8_ = local_98;
          auVar17._12_4_ = (int)((ulong)pIVar8->LogDenY[lVar12] >> 0x20);
          auVar17 = divpd(auVar16,auVar17);
          dVar25 = pIVar5->YAxis[lVar12].Range.Min;
          IVar1 = pIVar8->PixelRange[lVar12].Min;
          local_138.y = (float)(pIVar8->My[lVar12] *
                                (((double)(float)auVar17._8_8_ *
                                  (pIVar5->YAxis[lVar12].Range.Max - dVar25) + dVar25) - dVar25) +
                               (double)IVar1.y);
          local_138.x = (float)(pIVar8->Mx *
                                (((double)(float)auVar17._0_8_ * ((double)local_128._0_8_ - dVar24)
                                 + dVar24) - (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
          dVar24 = log10((local_118 + dVar22) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = pIVar9->CurrentPlot;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._0_8_ = dVar24;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          dVar24 = pIVar9->LogDenX;
          dVar25 = (pIVar5->XAxis).Range.Min;
          local_118 = (pIVar5->XAxis).Range.Max;
          uStack_110 = 0;
          dVar27 = log10((dVar27 + dVar26) / pIVar5->YAxis[lVar12].Range.Min);
          pIVar8 = local_70;
          pIVar5 = pIVar9->CurrentPlot;
          auVar18._8_8_ = dVar27;
          auVar18._0_8_ = local_128._0_8_;
          auVar6._8_4_ = SUB84(pIVar9->LogDenY[lVar12],0);
          auVar6._0_8_ = dVar24;
          auVar6._12_4_ = (int)((ulong)pIVar9->LogDenY[lVar12] >> 0x20);
          auVar17 = divpd(auVar18,auVar6);
          dVar24 = pIVar5->YAxis[lVar12].Range.Min;
          IVar1 = pIVar9->PixelRange[lVar12].Min;
          local_60.y = (float)(pIVar9->My[lVar12] *
                               (((double)(float)auVar17._8_8_ *
                                 (pIVar5->YAxis[lVar12].Range.Max - dVar24) + dVar24) - dVar24) +
                              (double)IVar1.y);
          local_60.x = (float)(pIVar9->Mx *
                               (((double)(float)auVar17._0_8_ * (local_118 - dVar25) + dVar25) -
                               (pIVar5->XAxis).Range.Min) + (double)IVar1.x);
          IVar28 = LerpColormap((float)(((double)plVar10[(int)uVar11 + lVar15] - local_d8) /
                                        local_b0 + 0.0));
          local_58 = IVar28._0_12_;
          fStack_4c = IVar28.w * (pIVar8->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(local_b8,&local_138,&local_60,col,0.0,0xf);
          dVar21 = (double)local_108._0_8_ + 1.0;
          lVar15 = lVar15 + 1;
          dVar24 = local_c0;
          dVar25 = local_68;
        } while ((int)local_c8 != (int)lVar15);
        uVar11 = (ulong)(uint)((int)local_78 + (int)lVar15);
        dVar27 = local_80;
        iVar14 = local_12c;
      }
      dVar27 = dVar27 + 1.0;
      iVar14 = iVar14 + 1;
    } while (iVar14 != rows);
    if (local_e0 != (char *)0x0 && 0 < rows) {
      iVar14 = 0;
      dVar25 = 0.0;
      iVar13 = 0;
      do {
        if (0 < cols) {
          local_128._0_8_ = local_f0 * dVar25 + local_f8;
          local_a8._0_4_ = iVar14;
          local_98 = local_e8 + iVar14;
          dVar27 = 0.0;
          lVar15 = 0;
          do {
            pIVar8 = GImPlot;
            dVar20 = (bounds_min->y + 1.0) - (double)local_128._0_8_;
            dVar26 = log10((dVar27 * dVar24 + bounds_min->x + dVar22) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar5 = pIVar8->CurrentPlot;
            local_118 = pIVar8->LogDenX;
            uStack_110 = 0;
            dVar24 = (pIVar5->XAxis).Range.Min;
            local_108._8_8_ = 0;
            local_108._0_8_ = (pIVar5->XAxis).Range.Max;
            dVar20 = log10(dVar20 / pIVar5->YAxis[lVar12].Range.Min);
            plVar10 = local_98;
            pIVar5 = pIVar8->CurrentPlot;
            auVar19._8_8_ = dVar20;
            auVar19._0_8_ = dVar26;
            auVar7._8_4_ = SUB84(pIVar8->LogDenY[lVar12],0);
            auVar7._0_8_ = local_118;
            auVar7._12_4_ = (int)((ulong)pIVar8->LogDenY[lVar12] >> 0x20);
            auVar17 = divpd(auVar19,auVar7);
            dVar26 = pIVar5->YAxis[lVar12].Range.Max;
            dVar20 = pIVar5->YAxis[lVar12].Range.Min;
            dVar23 = (double)local_108._0_8_ - dVar24;
            uVar2 = *(undefined8 *)((long)&pIVar8->PixelRange[0].Min.x + local_d0);
            dVar21 = (pIVar5->XAxis).Range.Min;
            dVar3 = pIVar8->Mx;
            dVar4 = pIVar8->My[lVar12];
            sprintf(local_58,local_e0,local_98[lVar15]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_108._8_4_ = extraout_XMM0_Dc_01;
            local_108._0_4_ = IVar1.x;
            local_108._4_4_ = IVar1.y;
            local_108._12_4_ = extraout_XMM0_Dd_01;
            IVar28 = LerpColormap((float)(((double)plVar10[lVar15] - local_d8) / local_b0 + 0.0));
            local_138.y = (float)local_108._4_4_ * -0.5 +
                          (float)(dVar4 * (((double)(float)auVar17._8_8_ * (dVar26 - dVar20) +
                                           dVar20) - dVar20) + (double)(float)((ulong)uVar2 >> 0x20)
                                 );
            local_138.x = (float)local_108._0_4_ * -0.5 +
                          (float)(dVar3 * (((double)(float)auVar17._0_8_ * dVar23 + dVar24) - dVar21
                                          ) + (double)(float)uVar2);
            ImDrawList::AddText(local_b8,&local_138,
                                -(uint)(IVar28.z * 0.114 + IVar28.x * 0.299 + IVar28.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            dVar27 = dVar27 + 1.0;
            lVar15 = lVar15 + 1;
            dVar24 = local_c0;
          } while ((int)local_c8 != (int)lVar15);
          iVar14 = local_a8._0_4_ + (int)lVar15;
        }
        dVar25 = dVar25 + 1.0;
        iVar13 = iVar13 + 1;
      } while (iVar13 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}